

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testIndicesAndLocations(FunctionalTest14_15 *this)

{
  GLuint type;
  long lVar1;
  bool bVar2;
  
  bVar2 = true;
  lVar1 = 0;
  do {
    if ((bVar2) &&
       (this->m_subroutine_indices[lVar1][0] == this->m_initial_subroutine_indices[lVar1][0])) {
      bVar2 = this->m_subroutine_indices[lVar1][1] == this->m_initial_subroutine_indices[lVar1][1];
    }
    else {
      bVar2 = false;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      bVar2 = this->m_subroutine_uniform_locations[lVar1] ==
              this->m_initial_subroutine_uniform_locations[lVar1];
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return bVar2;
}

Assistant:

bool FunctionalTest14_15::testIndicesAndLocations() const
{
	static const GLuint n_subroutine_types = 2;
	bool				result			   = true;

	/* Verify subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		result = result && (m_subroutine_indices[type][0] == m_initial_subroutine_indices[type][0]);
		result = result && (m_subroutine_indices[type][1] == m_initial_subroutine_indices[type][1]);
	}

	/* Verify subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_types; ++uniform)
	{
		result = result && (m_subroutine_uniform_locations[uniform] == m_initial_subroutine_uniform_locations[uniform]);
	}

	return result;
}